

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pit.c
# Opt level: O2

void ndn_pit_unregister_face(ndn_pit_t *self,ndn_table_id_t face_id)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ndn_table_id_t *pnVar4;
  
  bVar1 = (byte)face_id & 0x3f;
  pnVar4 = &self[5].capacity;
  for (uVar3 = 0; uVar3 < self->capacity; uVar3 = uVar3 + 1) {
    uVar2 = *(ulong *)(pnVar4 + -0x1c) & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    *(ulong *)(pnVar4 + -0x1c) = uVar2;
    if (((uVar2 == 0 && *pnVar4 != 0xffff) && (*(long *)(pnVar4 + -0xc) == 0)) &&
       (*(long *)(pnVar4 + -8) == 0)) {
      ndn_pit_remove_entry(self,(ndn_pit_entry_t *)(pnVar4 + -0x24));
    }
    pnVar4 = pnVar4 + 0x28;
  }
  return;
}

Assistant:

void
ndn_pit_unregister_face(ndn_pit_t* self, ndn_table_id_t face_id){
  for (ndn_table_id_t i = 0; i < self->capacity; ++i){
    self->slots[i].incoming_faces = bitset_unset(self->slots[i].incoming_faces, face_id);
    ndn_pit_remove_entry_if_empty(self, &self->slots[i]);
  }
}